

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

string * __thiscall
t_java_generator::type_to_enum_abi_cxx11_
          (string *__return_storage_ptr__,t_java_generator *this,t_type *type)

{
  uint uVar1;
  int iVar2;
  undefined8 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [16];
  allocator local_25;
  t_base local_24;
  t_base_type *ptStack_20;
  t_base tbase;
  t_type *type_local;
  t_java_generator *this_local;
  
  ptStack_20 = (t_base_type *)type;
  type_local = (t_type *)this;
  this_local = (t_java_generator *)__return_storage_ptr__;
  ptStack_20 = (t_base_type *)t_generator::get_true_type(type);
  uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[10])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0xb])();
      if (((uVar1 & 1) == 0) &&
         (uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar1 & 1) == 0)) {
        uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0x10])();
        if ((uVar1 & 1) == 0) {
          uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0xf])();
          if ((uVar1 & 1) == 0) {
            uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0xe])();
            if ((uVar1 & 1) == 0) goto switchD_0033cb51_default;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.LIST",
                       &local_3f);
            std::allocator<char>::~allocator((allocator<char> *)&local_3f);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.SET",
                       &local_3e);
            std::allocator<char>::~allocator((allocator<char> *)&local_3e);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.MAP",
                     &local_3d);
          std::allocator<char>::~allocator((allocator<char> *)&local_3d);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.STRUCT",
                   &local_3c);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.I32",&local_3b);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b);
    }
  }
  else {
    local_24 = t_base_type::get_base(ptStack_20);
    switch(local_24) {
    case TYPE_VOID:
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "NO T_VOID CONSTRUCT";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    case TYPE_STRING:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.STRING",
                 &local_25);
      std::allocator<char>::~allocator((allocator<char> *)&local_25);
      break;
    case TYPE_BOOL:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.BOOL",local_35);
      std::allocator<char>::~allocator((allocator<char> *)local_35);
      break;
    case TYPE_I8:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.BYTE",&local_36)
      ;
      std::allocator<char>::~allocator((allocator<char> *)&local_36);
      break;
    case TYPE_I16:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.I16",&local_37);
      std::allocator<char>::~allocator((allocator<char> *)&local_37);
      break;
    case TYPE_I32:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.I32",&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_38);
      break;
    case TYPE_I64:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.I64",&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      break;
    case TYPE_DOUBLE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"org.apache.thrift.protocol.TType.DOUBLE",
                 &local_3a);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a);
      break;
    default:
switchD_0033cb51_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar2 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_enum: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar2));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_java_generator::type_to_enum(t_type* type) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "NO T_VOID CONSTRUCT";
    case t_base_type::TYPE_STRING:
      return "org.apache.thrift.protocol.TType.STRING";
    case t_base_type::TYPE_BOOL:
      return "org.apache.thrift.protocol.TType.BOOL";
    case t_base_type::TYPE_I8:
      return "org.apache.thrift.protocol.TType.BYTE";
    case t_base_type::TYPE_I16:
      return "org.apache.thrift.protocol.TType.I16";
    case t_base_type::TYPE_I32:
      return "org.apache.thrift.protocol.TType.I32";
    case t_base_type::TYPE_I64:
      return "org.apache.thrift.protocol.TType.I64";
    case t_base_type::TYPE_DOUBLE:
      return "org.apache.thrift.protocol.TType.DOUBLE";
    }
  } else if (type->is_enum()) {
    return "org.apache.thrift.protocol.TType.I32";
  } else if (type->is_struct() || type->is_xception()) {
    return "org.apache.thrift.protocol.TType.STRUCT";
  } else if (type->is_map()) {
    return "org.apache.thrift.protocol.TType.MAP";
  } else if (type->is_set()) {
    return "org.apache.thrift.protocol.TType.SET";
  } else if (type->is_list()) {
    return "org.apache.thrift.protocol.TType.LIST";
  }

  throw "INVALID TYPE IN type_to_enum: " + type->get_name();
}